

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::quantize_float32_to_int8(Mat *src,Mat *dst,float scale,Option *opt)

{
  Layer *pLVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  float in_XMM0_Da;
  ParamDict pd;
  Layer *quantize;
  int in_stack_fffffffffffff6cc;
  ParamDict *in_stack_fffffffffffff6d0;
  undefined1 local_928 [40];
  Allocator *in_stack_fffffffffffff700;
  
  pLVar1 = create_layer(in_stack_fffffffffffff6cc);
  ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff700);
  ParamDict::set((ParamDict *)local_928,0,in_XMM0_Da);
  (*pLVar1->_vptr_Layer[2])(pLVar1,local_928);
  (*pLVar1->_vptr_Layer[4])(pLVar1,in_RDX);
  (*pLVar1->_vptr_Layer[7])(pLVar1,in_RDI,in_RSI,in_RDX);
  (*pLVar1->_vptr_Layer[5])(pLVar1,in_RDX);
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict(in_stack_fffffffffffff6d0);
  return;
}

Assistant:

void quantize_float32_to_int8(const Mat& src, Mat& dst, float scale, const Option& opt)
{
    Layer* quantize = create_layer(LayerType::Quantize);

    ParamDict pd;
    pd.set(0, scale);

    quantize->load_param(pd);

    quantize->create_pipeline(opt);

    quantize->forward(src, dst, opt);

    quantize->destroy_pipeline(opt);

    delete quantize;
}